

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::data<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  size_t sVar2;
  Err *pEVar3;
  Expression **ppEVar4;
  Name *pNVar5;
  basic_string_view<char,_std::char_traits<char>_> bVar6;
  Ok local_479;
  Err local_478;
  Err *local_458;
  Err *err_5;
  _Storage<wasm::Expression_*,_true> local_448;
  _Storage<wasm::Expression_*,_true> _Stack_440;
  bool local_438;
  undefined7 uStack_437;
  size_t sStack_430;
  undefined1 local_428 [8];
  Result<wasm::Ok> _val_5;
  string local_3f8;
  Err local_3d8;
  Err local_3b8;
  Err *local_398;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Result<wasm::Ok> str;
  string local_338;
  Err local_318;
  allocator<char> local_2f1;
  string local_2f0;
  Err local_2d0;
  _Storage<wasm::Expression_*,_true> local_2b0;
  _Storage<wasm::Expression_*,_true> _Stack_2a8;
  Err local_2a0;
  Err *local_280;
  Err *err_3;
  Result<wasm::Expression_*> _val_3;
  Result<wasm::Expression_*> offsetExpr;
  Err *err_2;
  MaybeResult<wasm::Ok> _val_2;
  _Storage<wasm::Expression_*,_true> local_1d0;
  allocator<char> local_1c1;
  string local_1c0;
  Err local_1a0;
  Err local_180;
  Err *local_160;
  Err *err_1;
  Result<wasm::Expression_*> _val_1;
  Result<wasm::Expression_*> e;
  _Storage<wasm::Expression_*,_true> _Stack_f8;
  optional<wasm::Expression_*> offset;
  Err local_e0;
  Err *local_c0;
  Err *err;
  undefined1 local_a8 [8];
  MaybeResult<wasm::Name> _val;
  MaybeResult<wasm::Name> mem;
  optional<wasm::Name> id;
  Name name;
  size_t pos;
  ParseDefsCtx *ctx_local;
  
  sVar2 = Lexer::getPos(&ctx->in);
  bVar6 = sv("data",4);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar6);
  if (!bVar1) {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  wasm::Name::Name((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._M_engaged);
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20),&ctx->in);
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional *)
                     ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  if (bVar1) {
    pNVar5 = std::optional<wasm::Name>::operator*
                       ((optional<wasm::Name> *)
                        ((long)&mem.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
    wasm::Name::operator=
              ((Name *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged,pNVar5);
  }
  __return_storage_ptr___00 =
       (__index_type *)
       ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20);
  maybeMemuse<wasm::WATParser::ParseDefsCtx>
            ((MaybeResult<wasm::Name> *)__return_storage_ptr___00,ctx);
  MaybeResult<wasm::Name>::MaybeResult
            ((MaybeResult<wasm::Name> *)local_a8,
             (MaybeResult<wasm::Name> *)__return_storage_ptr___00);
  local_c0 = MaybeResult<wasm::Name>::getErr((MaybeResult<wasm::Name> *)local_a8);
  offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Expression_*>._12_1_ = local_c0 != (Err *)0x0;
  if ((bool)offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Expression_*>._12_1_) {
    wasm::Err::Err(&local_e0,local_c0);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_e0);
    wasm::Err::~Err(&local_e0);
  }
  offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
  MaybeResult<wasm::Name>::~MaybeResult((MaybeResult<wasm::Name> *)local_a8);
  if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._12_4_ != 0) goto LAB_0248528b;
  std::optional<wasm::Expression_*>::optional((optional<wasm::Expression_*> *)&_Stack_f8);
  bVar6 = sv("offset",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,bVar6);
  if (bVar1) {
    expr<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Expression_*> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
    Result<wasm::Expression_*>::Result
              ((Result<wasm::Expression_*> *)&err_1,
               (Result<wasm::Expression_*> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
    local_160 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err_1);
    bVar1 = local_160 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_180,local_160);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_180);
      wasm::Err::~Err(&local_180);
    }
    offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
    offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Expression_*>._12_1_ = bVar1;
    Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err_1);
    if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        ppEVar4 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        std::optional<wasm::Expression_*>::optional<wasm::Expression_*&,_true>
                  ((optional<wasm::Expression_*> *)
                   ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20),ppEVar4);
        _Stack_f8 = (_Storage<wasm::Expression_*,_true>)
                    _val_2.val.super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                    super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err>._32_8_;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload = local_1d0;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1c0,"expected end of offset expression",&local_1c1);
        Lexer::err(&local_1a0,&ctx->in,&local_1c0);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_1a0);
        wasm::Err::~Err(&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        std::allocator<char>::~allocator(&local_1c1);
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ = 1;
      }
    }
    Result<wasm::Expression_*>::~Result
              ((Result<wasm::Expression_*> *)
               ((long)&_val_1.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
joined_r0x024849be:
    if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ != 0) goto LAB_0248528b;
  }
  else {
    bVar1 = Lexer::takeLParen(&ctx->in);
    if (bVar1) {
      instr<wasm::WATParser::ParseDefsCtx>((MaybeResult<wasm::Ok> *)&err_2,ctx);
      pEVar3 = MaybeResult<wasm::Ok>::getErr((MaybeResult<wasm::Ok> *)&err_2);
      if (pEVar3 != (Err *)0x0) {
        wasm::Err::Err((Err *)((long)&offsetExpr.val.
                                      super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),
                       pEVar3);
        MaybeResult<wasm::Ok>::MaybeResult
                  (__return_storage_ptr__,
                   (Err *)((long)&offsetExpr.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&offsetExpr.val.
                                       super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20)
                       );
      }
      offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
      offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._12_1_ = pEVar3 != (Err *)0x0;
      MaybeResult<wasm::Ok>::~MaybeResult((MaybeResult<wasm::Ok> *)&err_2);
      if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Expression_*>._12_4_ != 0) goto LAB_0248528b;
      ParseDefsCtx::makeExpr
                ((Result<wasm::Expression_*> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20),ctx);
      Result<wasm::Expression_*>::Result
                ((Result<wasm::Expression_*> *)&err_3,
                 (Result<wasm::Expression_*> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      local_280 = Result<wasm::Expression_*>::getErr((Result<wasm::Expression_*> *)&err_3);
      bVar1 = local_280 != (Err *)0x0;
      if (bVar1) {
        wasm::Err::Err(&local_2a0,local_280);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2a0);
        wasm::Err::~Err(&local_2a0);
      }
      offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
      offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Expression_*>._12_1_ = bVar1;
      Result<wasm::Expression_*>::~Result((Result<wasm::Expression_*> *)&err_3);
      if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Expression_*>._12_4_ == 0) {
        ppEVar4 = Result<wasm::Expression_*>::operator*
                            ((Result<wasm::Expression_*> *)
                             ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                                     super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                                     super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
        std::optional<wasm::Expression_*>::optional<wasm::Expression_*&,_true>
                  ((optional<wasm::Expression_*> *)&local_2b0,ppEVar4);
        _Stack_f8 = local_2b0;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._M_payload = _Stack_2a8;
        bVar1 = Lexer::takeRParen(&ctx->in);
        if (bVar1) {
          offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Expression_*>._12_4_ = 0;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2f0,"expected end of offset instruction",&local_2f1);
          Lexer::err(&local_2d0,&ctx->in,&local_2f0);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2d0);
          wasm::Err::~Err(&local_2d0);
          std::__cxx11::string::~string((string *)&local_2f0);
          std::allocator<char>::~allocator(&local_2f1);
          offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Expression_*>._12_4_ = 1;
        }
      }
      Result<wasm::Expression_*>::~Result
                ((Result<wasm::Expression_*> *)
                 ((long)&_val_3.val.super__Variant_base<wasm::Expression_*,_wasm::Err>.
                         super__Move_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Expression_*,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Expression_*,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Expression_*,_wasm::Err> + 0x20));
      goto joined_r0x024849be;
    }
  }
  bVar1 = wasm::MaybeResult::operator_cast_to_bool
                    ((MaybeResult *)
                     ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  if ((!bVar1) || (bVar1 = std::optional::operator_cast_to_bool((optional *)&_Stack_f8), bVar1)) {
    datastring<wasm::WATParser::ParseDefsCtx>
              ((Result<wasm::Ok> *)
               ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)&err_4,
               (Result<wasm::Ok> *)
               ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    local_398 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
    bVar1 = local_398 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_3b8,local_398);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3b8);
      wasm::Err::~Err(&local_3b8);
    }
    offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
    offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Expression_*>._12_1_ = bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
    if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        local_438 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged;
        uStack_437 = id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._17_7_;
        sStack_430 = name.super_IString.str._M_len;
        pNVar5 = MaybeResult<wasm::Name>::getPtr
                           ((MaybeResult<wasm::Name> *)
                            ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20
                            ));
        local_448 = _Stack_f8;
        _Stack_440 = offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Expression_*>._M_payload;
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        ParseDefsCtx::addData
                  (local_428,ctx,_local_438,sStack_430,pNVar5,sVar2 & 0xffffffff,local_448._0_4_,
                   _Stack_440._0_4_);
        local_458 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_428);
        bVar1 = local_458 != (Err *)0x0;
        if (bVar1) {
          wasm::Err::Err(&local_478,local_458);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_478);
          wasm::Err::~Err(&local_478);
        }
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._13_3_ = 0;
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_1_ = bVar1;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_428);
        if (offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::Expression_*>._12_4_ == 0) {
          MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_479);
          offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Expression_*>._12_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f8,"expected end of data segment",
                   (allocator<char> *)
                   ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        Lexer::err(&local_3d8,&ctx->in,&local_3f8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_3d8);
        wasm::Err::~Err(&local_3d8);
        std::__cxx11::string::~string((string *)&local_3f8);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
        offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Expression_*>._12_4_ = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_338,"expected offset for active segment",
               (allocator<char> *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    Lexer::err(&local_318,&ctx->in,&local_338);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_318);
    wasm::Err::~Err(&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&str.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x27));
    offset.super__Optional_base<wasm::Expression_*,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Expression_*>._12_4_ = 1;
  }
LAB_0248528b:
  MaybeResult<wasm::Name>::~MaybeResult
            ((MaybeResult<wasm::Name> *)
             ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::None,_wasm::Err> + 0x20));
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> data(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  if (!ctx.in.takeSExprStart("data"sv)) {
    return {};
  }

  Name name;
  if (auto id = ctx.in.takeID()) {
    name = *id;
  }

  auto mem = maybeMemuse(ctx);
  CHECK_ERR(mem);

  std::optional<typename Ctx::ExprT> offset;
  if (ctx.in.takeSExprStart("offset"sv)) {
    auto e = expr(ctx);
    CHECK_ERR(e);
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset expression");
    }
    offset = *e;
  } else if (ctx.in.takeLParen()) {
    CHECK_ERR(instr(ctx));
    auto offsetExpr = ctx.makeExpr();
    CHECK_ERR(offsetExpr);
    offset = *offsetExpr;
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected end of offset instruction");
    }
  }

  if (mem && !offset) {
    return ctx.in.err("expected offset for active segment");
  }

  auto str = datastring(ctx);
  CHECK_ERR(str);

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of data segment");
  }

  CHECK_ERR(ctx.addData(name, mem.getPtr(), offset, std::move(*str), pos));

  return Ok{};
}